

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isprint.c
# Opt level: O3

int main(void)

{
  ushort **ppuVar1;
  ushort *puVar2;
  
  ppuVar1 = __ctype_b_loc();
  puVar2 = *ppuVar1;
  if ((*(byte *)((long)puVar2 + 0xc3) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1b,"isprint( \'a\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0xf5) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1c,"isprint( \'z\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0x83) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1d,"isprint( \'A\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0xb5) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1e,"isprint( \'Z\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0x81) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1f,"isprint( \'@\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0x13) & 0x40) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x20,"! isprint( \'\\t\' )");
    puVar2 = *ppuVar1;
  }
  if ((*puVar2 & 0x4000) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x21,"! isprint( \'\\0\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0x41) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x22,"isprint( \' \' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isprint( 'a' ) );
    TESTCASE( isprint( 'z' ) );
    TESTCASE( isprint( 'A' ) );
    TESTCASE( isprint( 'Z' ) );
    TESTCASE( isprint( '@' ) );
    TESTCASE( ! isprint( '\t' ) );
    TESTCASE( ! isprint( '\0' ) );
    TESTCASE( isprint( ' ' ) );
    return TEST_RESULTS;
}